

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::AdvancedUsageUBO::Cleanup(AdvancedUsageUBO *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&(this->super_BasicUsageCS).field_0x34);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->uniform_buffer_);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_ssbo);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->prog_);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteBuffers(1, &counter_buffer_);
		glDeleteBuffers(1, &uniform_buffer_);
		glDeleteBuffers(1, &m_ssbo);
		glDeleteProgram(prog_);
		glUseProgram(0);
		return NO_ERROR;
	}